

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

void project_feature_handler_STORM(project_feature_handler_context_t *context)

{
  wchar_t wVar1;
  _Bool _Var2;
  uint32_t uVar3;
  loc grid;
  int iVar4;
  long lVar5;
  
  _Var2 = square_isview(cave,context->grid);
  if ((_Var2) && (player->timed[2] == 0)) {
    context->obvious = true;
  }
  if (L';' < context->dam) {
    _Var2 = square_isfloor(cave,context->grid);
    if (_Var2) {
      lVar5 = 0;
      iVar4 = 0;
      do {
        grid = (loc)loc_sum((loc_conflict)context->grid,(loc_conflict)ddgrid_ddd[lVar5]);
        _Var2 = square_iswatery(cave,grid);
        iVar4 = iVar4 + (uint)_Var2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      wVar1 = context->dam;
      uVar3 = Rand_div(400);
      if ((int)(uVar3 + 100) < iVar4 * 0x14 + wVar1) {
        square_set_feat(cave,context->grid,FEAT_WATER);
        return;
      }
    }
  }
  return;
}

Assistant:

static void project_feature_handler_STORM(project_feature_handler_context_t *context)
{
	/* Grid is in line of sight and player is not blind */
	if (square_isview(cave, context->grid) && !player->timed[TMD_BLIND]) {
		/* Observe */
		context->obvious = true;
	}

	/* Require strong attack.  Require floor. */
	if ((context->dam >= 60) && square_isfloor(cave, context->grid)) {
		int d, k = 0;

		/* Look around for nearby water. */
		for (d = 0; d < 8; d++) {
			/* Extract adjacent (legal) location */
			struct loc grid = loc_sum(context->grid, ddgrid_ddd[d]);

			/* Count the water grids. */
			if (square_iswatery(cave, grid))
				k++;
		}

		/* If enough water available, make pool. */
		if ((context->dam + (k * 20)) > 100 + (randint0(400))) {
			/* Create water */
			square_set_feat(cave, context->grid, FEAT_WATER);
		}
	}
}